

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_casts.cpp
# Opt level: O1

bool duckdb::EnumToVarcharCast<unsigned_char>
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  ulong *puVar1;
  data_ptr_t pdVar2;
  byte *pbVar3;
  unsigned_long *puVar4;
  data_ptr_t pdVar5;
  sel_t *psVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar7;
  undefined8 uVar8;
  element_type *peVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  Vector *pVVar11;
  TemplatedValidityData<unsigned_long> *pTVar12;
  idx_t iVar13;
  ulong uVar14;
  idx_t iVar15;
  data_ptr_t pdVar16;
  ulong uVar17;
  ulong uVar18;
  unsigned_long uVar19;
  data_ptr_t pdVar20;
  ulong uVar21;
  idx_t idx_in_entry;
  ulong uVar22;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  buffer_ptr<ValidityBuffer> *local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  pVVar11 = EnumType::GetValuesInsertOrder(&source->type);
  pdVar2 = pVVar11->data;
  if (source->vector_type == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar16 = result->data;
    pdVar5 = source->data;
    FlatVector::VerifyFlatVector(source);
    FlatVector::VerifyFlatVector(result);
    puVar4 = (source->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar4 == (unsigned_long *)0x0) {
      if (count != 0) {
        pdVar16 = pdVar16 + 8;
        iVar13 = 0;
        do {
          uVar8 = *(undefined8 *)(pdVar2 + (ulong)pdVar5[iVar13] * 0x10 + 8);
          *(undefined8 *)(pdVar16 + -8) = *(undefined8 *)(pdVar2 + (ulong)pdVar5[iVar13] * 0x10);
          *(undefined8 *)pdVar16 = uVar8;
          iVar13 = iVar13 + 1;
          pdVar16 = pdVar16 + 0x10;
        } while (count != iVar13);
      }
    }
    else {
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar4;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                 &(source->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
           (source->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      if (0x3f < count + 0x3f) {
        puVar4 = (source->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        uVar17 = 0;
        uVar22 = 0;
        do {
          if (puVar4 == (unsigned_long *)0x0) {
            uVar19 = 0xffffffffffffffff;
          }
          else {
            uVar19 = puVar4[uVar17];
          }
          uVar18 = uVar22 + 0x40;
          if (count <= uVar22 + 0x40) {
            uVar18 = count;
          }
          uVar14 = uVar18;
          if (uVar19 != 0) {
            uVar14 = uVar22;
            if (uVar19 == 0xffffffffffffffff) {
              if (uVar22 < uVar18) {
                pdVar20 = pdVar16 + uVar22 * 0x10 + 8;
                do {
                  uVar8 = *(undefined8 *)(pdVar2 + (ulong)pdVar5[uVar14] * 0x10 + 8);
                  *(undefined8 *)(pdVar20 + -8) =
                       *(undefined8 *)(pdVar2 + (ulong)pdVar5[uVar14] * 0x10);
                  *(undefined8 *)pdVar20 = uVar8;
                  uVar14 = uVar14 + 1;
                  pdVar20 = pdVar20 + 0x10;
                } while (uVar18 != uVar14);
              }
            }
            else if (uVar22 < uVar18) {
              pdVar20 = pdVar16 + uVar22 * 0x10 + 8;
              uVar21 = 0;
              do {
                if ((uVar19 >> (uVar21 & 0x3f) & 1) != 0) {
                  uVar8 = *(undefined8 *)(pdVar2 + (ulong)pdVar5[uVar22] * 0x10 + 8);
                  *(undefined8 *)(pdVar20 + -8) =
                       *(undefined8 *)(pdVar2 + (ulong)pdVar5[uVar22] * 0x10);
                  *(undefined8 *)pdVar20 = uVar8;
                }
                uVar22 = uVar22 + 1;
                pdVar20 = pdVar20 + 0x10;
                uVar21 = uVar21 + 1;
                uVar14 = uVar22;
              } while (uVar18 != uVar22);
            }
          }
          uVar17 = uVar17 + 1;
          uVar22 = uVar14;
        } while (uVar17 != count + 0x3f >> 6);
      }
    }
  }
  else if (source->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    pdVar16 = result->data;
    pbVar3 = source->data;
    puVar4 = (source->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) {
      ConstantVector::SetNull(result,false);
      uVar8 = *(undefined8 *)(pdVar2 + (ulong)*pbVar3 * 0x10 + 8);
      *(undefined8 *)pdVar16 = *(undefined8 *)(pdVar2 + (ulong)*pbVar3 * 0x10);
      *(undefined8 *)(pdVar16 + 8) = uVar8;
    }
    else {
      ConstantVector::SetNull(result,true);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(source,count,&local_78);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar16 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar6 = (local_78.sel)->sel_vector;
        pdVar16 = pdVar16 + 8;
        iVar13 = 0;
        do {
          iVar15 = iVar13;
          if (psVar6 != (sel_t *)0x0) {
            iVar15 = (idx_t)psVar6[iVar13];
          }
          uVar8 = *(undefined8 *)(pdVar2 + (ulong)local_78.data[iVar15] * 0x10 + 8);
          *(undefined8 *)(pdVar16 + -8) =
               *(undefined8 *)(pdVar2 + (ulong)local_78.data[iVar15] * 0x10);
          *(undefined8 *)pdVar16 = uVar8;
          iVar13 = iVar13 + 1;
          pdVar16 = pdVar16 + 0x10;
        } while (count != iVar13);
      }
    }
    else if (count != 0) {
      psVar6 = (local_78.sel)->sel_vector;
      local_88 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      pdVar16 = pdVar16 + 8;
      uVar22 = 0;
      do {
        uVar17 = uVar22;
        if (psVar6 != (sel_t *)0x0) {
          uVar17 = (ulong)psVar6[uVar22];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar17 >> 6]
             >> (uVar17 & 0x3f) & 1) == 0) {
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_98,&local_80);
            p_Var10 = p_Stack_90;
            peVar9 = local_98;
            local_98 = (element_type *)0x0;
            p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar9;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var10;
            if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
            }
            if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
            }
            pTVar12 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_88);
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 (unsigned_long *)
                 (pTVar12->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
          }
          bVar7 = (byte)uVar22 & 0x3f;
          puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                   (uVar22 >> 6);
          *puVar1 = *puVar1 & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
        }
        else {
          uVar8 = *(undefined8 *)(pdVar2 + (ulong)local_78.data[uVar17] * 0x10 + 8);
          *(undefined8 *)(pdVar16 + -8) =
               *(undefined8 *)(pdVar2 + (ulong)local_78.data[uVar17] * 0x10);
          *(undefined8 *)pdVar16 = uVar8;
        }
        uVar22 = uVar22 + 1;
        pdVar16 = pdVar16 + 0x10;
      } while (count != uVar22);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return true;
}

Assistant:

static bool EnumToVarcharCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto &enum_dictionary = EnumType::GetValuesInsertOrder(source.GetType());
	auto dictionary_data = FlatVector::GetData<string_t>(enum_dictionary);

	UnaryExecutor::Execute<SRC, string_t>(source, result, count,
	                                      [&](SRC enum_idx) { return dictionary_data[enum_idx]; });
	return true;
}